

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ExpressionResultBuilder::ExpressionResultBuilder
          (ExpressionResultBuilder *this,ExpressionResultBuilder *other)

{
  string local_40 [32];
  
  AssertionResultData::AssertionResultData(&this->m_data,&other->m_data);
  ExprComponents::ExprComponents(&this->m_exprComponents,&other->m_exprComponents);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&this->m_stream,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

ExpressionResultBuilder::ExpressionResultBuilder( const ExpressionResultBuilder& other )
    :   m_data( other.m_data ),
        m_exprComponents( other.m_exprComponents )
    {
        m_stream << other.m_stream.str();
    }